

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_jsr_w(ExecutionEngine *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  Value operand;
  u4 uVar6;
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar7;
  undefined4 local_40;
  Value returnAddr;
  int32_t branchOffset;
  u1 byte4;
  u1 byte3;
  u1 byte2;
  u1 byte1;
  u1 *code;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  puVar7 = Frame::getCode(this_01,this_01->pc);
  bVar1 = puVar7[1];
  bVar2 = puVar7[2];
  bVar3 = puVar7[3];
  bVar4 = puVar7[4];
  operand.type = 8;
  operand.printType = local_40;
  operand.data.longValue._4_4_ = returnAddr.type;
  operand.data.intValue = this_01->pc + 5;
  Frame::pushIntoOperandStack(this_01,operand);
  this_01->pc = ((uint)bVar1 << 0x18 | (uint)bVar2 << 0x10 | (uint)bVar3 << 8 | (uint)bVar4) +
                this_01->pc;
  uVar5 = this_01->pc;
  uVar6 = Frame::sizeCode(this_01);
  if (uVar5 < uVar6) {
    return;
  }
  __assert_fail("topFrame->pc < (int32_t)topFrame->sizeCode()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x129f,"void ExecutionEngine::i_jsr_w()");
}

Assistant:

void ExecutionEngine::i_jsr_w() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	u1 *code = topFrame->getCode(topFrame->pc);
	u1 byte1 = code[1];
	u1 byte2 = code[2];
	u1 byte3 = code[3];
	u1 byte4 = code[4];
	int32_t branchOffset = (byte1 << 24) | (byte2 << 16) | (byte3 << 8)| byte4;

	Value returnAddr;
	returnAddr.type = ValueType::RETURN_ADDR;
	returnAddr.data.returnAddress = topFrame->pc + 5;
	topFrame->pushIntoOperandStack(returnAddr);

	topFrame->pc += branchOffset;
	assert(topFrame->pc < (int32_t)topFrame->sizeCode());
}